

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int doRegisterArchiver(PHYSFS_Archiver *_archiver)

{
  int iVar1;
  PHYSFS_uint64 PVar2;
  PHYSFS_Archiver *__dest;
  char *pcVar3;
  PHYSFS_ArchiveInfo **ppPVar4;
  PHYSFS_Archiver **ppPVar5;
  ulong local_50;
  size_t i;
  void *ptr;
  char *ext;
  PHYSFS_ArchiveInfo *info;
  PHYSFS_Archiver *archiver;
  size_t len;
  PHYSFS_uint32 maxver;
  PHYSFS_Archiver *_archiver_local;
  
  PVar2 = (numArchivers + 2) * 8;
  ext = (char *)0x0;
  if (_archiver == (PHYSFS_Archiver *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else if (_archiver->version == 0) {
    if ((_archiver->info).extension == (char *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if ((_archiver->info).description == (char *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if ((_archiver->info).author == (char *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if ((_archiver->info).url == (char *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->openArchive == (_func_void_ptr_PHYSFS_Io_ptr_char_ptr_int_int_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->enumerate ==
             (_func_PHYSFS_EnumerateCallbackResult_void_ptr_char_ptr_PHYSFS_EnumerateCallback_char_ptr_void_ptr
              *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->openRead == (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->openWrite == (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->openAppend == (_func_PHYSFS_Io_ptr_void_ptr_char_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->remove == (_func_int_void_ptr_char_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->mkdir == (_func_int_void_ptr_char_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->closeArchive == (_func_void_void_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else if (_archiver->stat == (_func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *)0x0) {
      PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    }
    else {
      pcVar3 = (_archiver->info).extension;
      for (local_50 = 0; local_50 < numArchivers; local_50 = local_50 + 1) {
        iVar1 = PHYSFS_utf8stricmp(archiveInfo[local_50]->extension,pcVar3);
        if (iVar1 == 0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_DUPLICATE);
          return 0;
        }
      }
      __dest = (PHYSFS_Archiver *)(*__PHYSFS_AllocatorHooks.Malloc)(0x78);
      if (__dest == (PHYSFS_Archiver *)0x0) {
        PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      }
      else {
        memcpy(__dest,_archiver,0x78);
        ext = (char *)&__dest->info;
        memset(ext,0,0x28);
        pcVar3 = __PHYSFS_strdup((_archiver->info).extension);
        ((PHYSFS_ArchiveInfo *)ext)->extension = pcVar3;
        if (((PHYSFS_ArchiveInfo *)ext)->extension == (char *)0x0) {
          PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
        }
        else {
          pcVar3 = __PHYSFS_strdup((_archiver->info).description);
          (__dest->info).description = pcVar3;
          if ((__dest->info).description == (char *)0x0) {
            PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
          }
          else {
            pcVar3 = __PHYSFS_strdup((_archiver->info).author);
            (__dest->info).author = pcVar3;
            if ((__dest->info).author == (char *)0x0) {
              PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
            }
            else {
              pcVar3 = __PHYSFS_strdup((_archiver->info).url);
              (__dest->info).url = pcVar3;
              if ((__dest->info).url == (char *)0x0) {
                PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
              }
              else {
                (__dest->info).supportsSymlinks = (_archiver->info).supportsSymlinks;
                ppPVar4 = (PHYSFS_ArchiveInfo **)
                          (*__PHYSFS_AllocatorHooks.Realloc)(archiveInfo,PVar2);
                if (ppPVar4 == (PHYSFS_ArchiveInfo **)0x0) {
                  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                }
                else {
                  archiveInfo = ppPVar4;
                  ppPVar5 = (PHYSFS_Archiver **)(*__PHYSFS_AllocatorHooks.Realloc)(archivers,PVar2);
                  if (ppPVar5 != (PHYSFS_Archiver **)0x0) {
                    archivers = ppPVar5;
                    archiveInfo[numArchivers] = (PHYSFS_ArchiveInfo *)ext;
                    archiveInfo[numArchivers + 1] = (PHYSFS_ArchiveInfo *)0x0;
                    archivers[numArchivers] = __dest;
                    archivers[numArchivers + 1] = (PHYSFS_Archiver *)0x0;
                    numArchivers = numArchivers + 1;
                    return 1;
                  }
                  PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                }
              }
            }
          }
        }
      }
      if (ext != (char *)0x0) {
        (*__PHYSFS_AllocatorHooks.Free)(*(void **)ext);
        (*__PHYSFS_AllocatorHooks.Free)(*(void **)(ext + 8));
        (*__PHYSFS_AllocatorHooks.Free)(*(void **)(ext + 0x10));
        (*__PHYSFS_AllocatorHooks.Free)(*(void **)(ext + 0x18));
      }
      (*__PHYSFS_AllocatorHooks.Free)(__dest);
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
  }
  return 0;
}

Assistant:

static int doRegisterArchiver(const PHYSFS_Archiver *_archiver)
{
    const PHYSFS_uint32 maxver = CURRENT_PHYSFS_ARCHIVER_API_VERSION;
    const size_t len = (numArchivers + 2) * sizeof (void *);
    PHYSFS_Archiver *archiver = NULL;
    PHYSFS_ArchiveInfo *info = NULL;
    const char *ext = NULL;
    void *ptr = NULL;
    size_t i;

    BAIL_IF(!_archiver, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(_archiver->version > maxver, PHYSFS_ERR_UNSUPPORTED, 0);
    BAIL_IF(!_archiver->info.extension, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.description, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.author, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->info.url, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openArchive, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->enumerate, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openRead, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openWrite, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->openAppend, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->remove, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->mkdir, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->closeArchive, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    BAIL_IF(!_archiver->stat, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    ext = _archiver->info.extension;
    for (i = 0; i < numArchivers; i++)
    {
        if (PHYSFS_utf8stricmp(archiveInfo[i]->extension, ext) == 0)
            BAIL(PHYSFS_ERR_DUPLICATE, 0);
    } /* for */

    /* make a copy of the data. */
    archiver = (PHYSFS_Archiver *) allocator.Malloc(sizeof (*archiver));
    GOTO_IF(!archiver, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);

    /* Must copy sizeof (OLD_VERSION_OF_STRUCT) when version changes! */
    memcpy(archiver, _archiver, sizeof (*archiver));

    info = (PHYSFS_ArchiveInfo *) &archiver->info;
    memset(info, '\0', sizeof (*info));  /* NULL in case an alloc fails. */
    #define CPYSTR(item) \
        info->item = __PHYSFS_strdup(_archiver->info.item); \
        GOTO_IF(!info->item, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    CPYSTR(extension);
    CPYSTR(description);
    CPYSTR(author);
    CPYSTR(url);
    info->supportsSymlinks = _archiver->info.supportsSymlinks;
    #undef CPYSTR

    ptr = allocator.Realloc(archiveInfo, len);
    GOTO_IF(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    archiveInfo = (PHYSFS_ArchiveInfo **) ptr;

    ptr = allocator.Realloc(archivers, len);
    GOTO_IF(!ptr, PHYSFS_ERR_OUT_OF_MEMORY, regfailed);
    archivers = (PHYSFS_Archiver **) ptr;

    archiveInfo[numArchivers] = info;
    archiveInfo[numArchivers + 1] = NULL;

    archivers[numArchivers] = archiver;
    archivers[numArchivers + 1] = NULL;

    numArchivers++;

    return 1;

regfailed:
    if (info != NULL)
    {
        allocator.Free((void *) info->extension);
        allocator.Free((void *) info->description);
        allocator.Free((void *) info->author);
        allocator.Free((void *) info->url);
    } /* if */
    allocator.Free(archiver);

    return 0;
}